

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O0

int fiobj_task_wrapper(FIOBJ o,void *p_)

{
  int iVar1;
  fiobj_object_vtable_s *pfVar2;
  int ret;
  task_packet_s *p;
  void *p__local;
  FIOBJ o_local;
  
  *(long *)((long)p_ + 0x20) = *(long *)((long)p_ + 0x20) + 1;
  iVar1 = (**p_)(o,*(undefined8 *)((long)p_ + 8));
  if (iVar1 == -1) {
    *(undefined1 *)((long)p_ + 0x28) = 1;
    o_local._4_4_ = -1;
  }
  else {
    if ((((o != 0) && ((o & 1) == 0)) && ((o & 6) != 6)) &&
       (pfVar2 = fiobj_type_vtable(o),
       pfVar2->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)) {
      *(undefined1 *)((long)p_ + 0x29) = 1;
      *(FIOBJ *)((long)p_ + 0x18) = o;
      return -1;
    }
    o_local._4_4_ = 0;
  }
  return o_local._4_4_;
}

Assistant:

static int fiobj_task_wrapper(FIOBJ o, void *p_) {
  struct task_packet_s *p = p_;
  ++p->counter;
  int ret = p->task(o, p->arg);
  if (ret == -1) {
    p->stop = 1;
    return -1;
  }
  if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each) {
    p->incomplete = 1;
    p->next = o;
    return -1;
  }
  return 0;
}